

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O1

int Gia_ManChoiceLevel(Gia_Man_t *p)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  uint uVar4;
  Vec_Int_t *pVVar5;
  ulong uVar6;
  int Fill;
  int Fill_00;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 uVar7;
  undefined8 extraout_RDX_04;
  int iVar8;
  long lVar9;
  long lVar10;
  
  Gia_ManCleanLevels(p,p->nObjs);
  Gia_ManIncrementTravId(p);
  pVVar5 = p->vCos;
  uVar7 = extraout_RDX;
  if (pVVar5->nSize < 1) {
    iVar8 = 0;
  }
  else {
    lVar9 = 0;
    iVar8 = 0;
    do {
      iVar2 = pVVar5->pArray[lVar9];
      if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) goto LAB_0020db75;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar1 = p->pObjs + iVar2;
      Gia_ManChoiceLevel_rec(p,pGVar1);
      pGVar3 = p->pObjs;
      if ((pGVar1 < pGVar3) || (pGVar3 + p->nObjs <= pGVar1)) goto LAB_0020db37;
      uVar4 = (int)((long)pGVar1 - (long)pGVar3 >> 2) * -0x55555555;
      pVVar5 = p->vLevels;
      Vec_IntFillExtra(pVVar5,uVar4 + 1,Fill);
      if (((int)uVar4 < 0) || (pVVar5->nSize <= (int)uVar4)) goto LAB_0020db56;
      uVar7 = extraout_RDX_00;
      if (iVar8 < pVVar5->pArray[uVar4 & 0x7fffffff]) {
        pGVar3 = p->pObjs;
        if ((pGVar1 < pGVar3) || (pGVar3 + p->nObjs <= pGVar1)) goto LAB_0020db37;
        uVar4 = (int)((long)pGVar1 - (long)pGVar3 >> 2) * -0x55555555;
        pVVar5 = p->vLevels;
        Vec_IntFillExtra(pVVar5,uVar4 + 1,(int)extraout_RDX_00);
        if (((int)uVar4 < 0) || (pVVar5->nSize <= (int)uVar4)) goto LAB_0020db56;
        iVar8 = pVVar5->pArray[uVar4 & 0x7fffffff];
        uVar7 = extraout_RDX_01;
      }
      lVar9 = lVar9 + 1;
      pVVar5 = p->vCos;
    } while (lVar9 < pVVar5->nSize);
  }
  pVVar5 = p->vCis;
  if (pVVar5->nSize < 1) {
LAB_0020dab9:
    uVar6 = (ulong)(uint)p->nObjs;
    if (0 < p->nObjs) {
      lVar10 = 0;
      lVar9 = 0;
      do {
        if (p->pObjs == (Gia_Obj_t *)0x0) {
          return iVar8;
        }
        uVar4 = *(uint *)(&p->pObjs->field_0x0 + lVar10);
        uVar7 = CONCAT71((int7)((ulong)uVar7 >> 8),(int)uVar4 < 0);
        if ((~uVar4 & 0x1fffffff) != 0 && (int)uVar4 >= 0) {
          if ((int)uVar6 <= lVar9) {
LAB_0020db37:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          pVVar5 = p->vLevels;
          Vec_IntFillExtra(pVVar5,(int)lVar9 + 1,(int)uVar7);
          if (pVVar5->nSize <= lVar9) {
LAB_0020db56:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          uVar7 = extraout_RDX_04;
          if (pVVar5->pArray[lVar9] < 1) {
            __assert_fail("Gia_ObjLevel(p, pObj) > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                          ,0x2f1,"int Gia_ManChoiceLevel(Gia_Man_t *)");
          }
        }
        lVar9 = lVar9 + 1;
        uVar6 = (ulong)p->nObjs;
        lVar10 = lVar10 + 0xc;
      } while (lVar9 < (long)uVar6);
    }
    return iVar8;
  }
  lVar9 = 0;
  do {
    iVar2 = pVVar5->pArray[lVar9];
    if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) {
LAB_0020db75:
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    if (p->pObjs == (Gia_Obj_t *)0x0) goto LAB_0020dab9;
    pGVar1 = p->pObjs + iVar2;
    Gia_ManChoiceLevel_rec(p,pGVar1);
    pGVar3 = p->pObjs;
    if ((pGVar1 < pGVar3) || (pGVar3 + p->nObjs <= pGVar1)) goto LAB_0020db37;
    uVar4 = (int)((long)pGVar1 - (long)pGVar3 >> 2) * -0x55555555;
    pVVar5 = p->vLevels;
    Vec_IntFillExtra(pVVar5,uVar4 + 1,Fill_00);
    if (((int)uVar4 < 0) || (pVVar5->nSize <= (int)uVar4)) goto LAB_0020db56;
    uVar7 = extraout_RDX_02;
    if (iVar8 < pVVar5->pArray[uVar4 & 0x7fffffff]) {
      pGVar3 = p->pObjs;
      if ((pGVar1 < pGVar3) || (pGVar3 + p->nObjs <= pGVar1)) goto LAB_0020db37;
      uVar4 = (int)((long)pGVar1 - (long)pGVar3 >> 2) * -0x55555555;
      pVVar5 = p->vLevels;
      Vec_IntFillExtra(pVVar5,uVar4 + 1,(int)extraout_RDX_02);
      if (((int)uVar4 < 0) || (pVVar5->nSize <= (int)uVar4)) goto LAB_0020db56;
      iVar8 = pVVar5->pArray[uVar4 & 0x7fffffff];
      uVar7 = extraout_RDX_03;
    }
    lVar9 = lVar9 + 1;
    pVVar5 = p->vCis;
    if (pVVar5->nSize <= lVar9) goto LAB_0020dab9;
  } while( true );
}

Assistant:

int Gia_ManChoiceLevel( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i, LevelMax = 0;
//    assert( Gia_ManRegNum(p) == 0 );
    Gia_ManCleanLevels( p, Gia_ManObjNum(p) );
    Gia_ManIncrementTravId( p );
    Gia_ManForEachCo( p, pObj, i )
    {
        Gia_ManChoiceLevel_rec( p, pObj );
        if ( LevelMax < Gia_ObjLevel(p, pObj) )
            LevelMax = Gia_ObjLevel(p, pObj);
    }
    // account for dangling boxes
    Gia_ManForEachCi( p, pObj, i )
    {
        Gia_ManChoiceLevel_rec( p, pObj );
        if ( LevelMax < Gia_ObjLevel(p, pObj) )
            LevelMax = Gia_ObjLevel(p, pObj);
//        Abc_Print( 1, "%d ", Gia_ObjLevel(p, pObj) );
    }
//    Abc_Print( 1, "\n" );
    Gia_ManForEachAnd( p, pObj, i )
        assert( Gia_ObjLevel(p, pObj) > 0 );
//    printf( "Max level %d\n", LevelMax );
    return LevelMax;
}